

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

int Abc_SclGetRealFaninLit(Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  
  if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
    uVar1 = Abc_SclGetRealFaninLit((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
    uVar2 = Abc_SclIsInv(pObj);
    uVar2 = uVar2 ^ uVar1;
  }
  else {
    if (pObj->Id < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    uVar2 = pObj->Id * 2;
  }
  return uVar2;
}

Assistant:

int Abc_SclGetRealFaninLit( Abc_Obj_t * pObj )
{
    int iLit;
    if ( !Abc_SclObjIsBufInv(pObj) )
        return Abc_Var2Lit( Abc_ObjId(pObj), 0 );
    iLit = Abc_SclGetRealFaninLit( Abc_ObjFanin0(pObj) );
    return Abc_LitNotCond( iLit, Abc_SclIsInv(pObj) );
}